

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::ContainerPrinter::
     PrintValue<std::forward_list<bool,std::allocator<bool>>,void>
               (forward_list<bool,_std::allocator<bool>_> *container,ostream *os)

{
  long lVar1;
  
  std::operator<<(os,'{');
  lVar1 = 0;
  do {
    container = (forward_list<bool,_std::allocator<bool>_> *)
                ((_Fwd_list_node_base *)container)->_M_next;
    if ((_Fwd_list_impl)container == (_Fwd_list_impl)0x0) {
      if (lVar1 != 0) {
LAB_001cf622:
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    if ((lVar1 != 0) && (std::operator<<(os,','), lVar1 == 0x20)) {
      std::operator<<(os," ...");
      goto LAB_001cf622;
    }
    std::operator<<(os,' ');
    UniversalPrinter<bool>::Print((bool *)((long)container + 8),os);
    lVar1 = lVar1 + 1;
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }